

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi__tga_info(stbi__context *s,int *x,int *y,int *comp)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  int iVar4;
  uint bits_per_pixel;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  stbi__context *in_RDI;
  int tga_colormap_type;
  int sz;
  int tga_colormap_bpp;
  int tga_bits_per_pixel;
  int tga_image_type;
  int tga_comp;
  int tga_h;
  int tga_w;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar5;
  uint local_40;
  int local_34;
  int local_4;
  
  stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  bVar1 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
  ;
  if (1 < bVar1) {
    stbi__rewind(in_RDI);
    return 0;
  }
  sVar2 = stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8))
  ;
  if (bVar1 == 1) {
    if ((sVar2 != '\x01') && (sVar2 != '\t')) {
      stbi__rewind(in_RDI);
      return 0;
    }
    stbi__skip((stbi__context *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
    bVar1 = stbi__get8((stbi__context *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_40 = (uint)bVar1;
    if (((local_40 != 8) && (local_40 != 0xf)) &&
       ((local_40 != 0x10 && ((local_40 != 0x18 && (local_40 != 0x20)))))) {
      stbi__rewind(in_RDI);
      return 0;
    }
    stbi__skip((stbi__context *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
  }
  else {
    if ((((sVar2 != '\x02') && (sVar2 != '\x03')) && (sVar2 != '\n')) && (sVar2 != '\v')) {
      stbi__rewind(in_RDI);
      return 0;
    }
    stbi__skip((stbi__context *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac);
    local_40 = 0;
  }
  iVar3 = stbi__get16le((stbi__context *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (iVar3 < 1) {
    stbi__rewind(in_RDI);
    local_4 = 0;
  }
  else {
    iVar4 = stbi__get16le((stbi__context *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (iVar4 < 1) {
      stbi__rewind(in_RDI);
      local_4 = 0;
    }
    else {
      bVar1 = stbi__get8((stbi__context *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      bits_per_pixel = (uint)bVar1;
      stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (local_40 == 0) {
        uVar5 = 0x1000000;
        if (sVar2 != '\x03') {
          uVar5 = (uint)(sVar2 == '\v') << 0x18;
        }
        local_34 = stbi__tga_get_comp(bits_per_pixel,uVar5 >> 0x18,(int *)0x0);
      }
      else {
        if ((bits_per_pixel != 8) && (bits_per_pixel != 0x10)) {
          stbi__rewind(in_RDI);
          return 0;
        }
        local_34 = stbi__tga_get_comp(local_40,0,(int *)0x0);
      }
      if (local_34 == 0) {
        stbi__rewind(in_RDI);
        local_4 = 0;
      }
      else {
        if (in_RSI != (int *)0x0) {
          *in_RSI = iVar3;
        }
        if (in_RDX != (int *)0x0) {
          *in_RDX = iVar4;
        }
        if (in_RCX != (int *)0x0) {
          *in_RCX = local_34;
        }
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

static int stbi__tga_info(stbi__context *s, int *x, int *y, int *comp)
{
    int tga_w, tga_h, tga_comp, tga_image_type, tga_bits_per_pixel, tga_colormap_bpp;
    int sz, tga_colormap_type;
    stbi__get8(s);                   // discard Offset
    tga_colormap_type = stbi__get8(s); // colormap type
    if( tga_colormap_type > 1 ) {
        stbi__rewind(s);
        return 0;      // only RGB or indexed allowed
    }
    tga_image_type = stbi__get8(s); // image type
    if ( tga_colormap_type == 1 ) { // colormapped (paletted) image
        if (tga_image_type != 1 && tga_image_type != 9) {
            stbi__rewind(s);
            return 0;
        }
        stbi__skip(s,4);       // skip index of first colormap entry and number of entries
        sz = stbi__get8(s);    //   check bits per palette color entry
        if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) {
            stbi__rewind(s);
            return 0;
        }
        stbi__skip(s,4);       // skip image x and y origin
        tga_colormap_bpp = sz;
    } else { // "normal" image w/o colormap - only RGB or grey allowed, +/- RLE
        if ( (tga_image_type != 2) && (tga_image_type != 3) && (tga_image_type != 10) && (tga_image_type != 11) ) {
            stbi__rewind(s);
            return 0; // only RGB or grey allowed, +/- RLE
        }
        stbi__skip(s,9); // skip colormap specification and image x/y origin
        tga_colormap_bpp = 0;
    }
    tga_w = stbi__get16le(s);
    if( tga_w < 1 ) {
        stbi__rewind(s);
        return 0;   // test width
    }
    tga_h = stbi__get16le(s);
    if( tga_h < 1 ) {
        stbi__rewind(s);
        return 0;   // test height
    }
    tga_bits_per_pixel = stbi__get8(s); // bits per pixel
    stbi__get8(s); // ignore alpha bits
    if (tga_colormap_bpp != 0) {
        if((tga_bits_per_pixel != 8) && (tga_bits_per_pixel != 16)) {
            // when using a colormap, tga_bits_per_pixel is the size of the indexes
            // I don't think anything but 8 or 16bit indexes makes sense
            stbi__rewind(s);
            return 0;
        }
        tga_comp = stbi__tga_get_comp(tga_colormap_bpp, 0, NULL);
    } else {
        tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3) || (tga_image_type == 11), NULL);
    }
    if(!tga_comp) {
      stbi__rewind(s);
      return 0;
    }
    if (x) *x = tga_w;
    if (y) *y = tga_h;
    if (comp) *comp = tga_comp;
    return 1;                   // seems to have passed everything
}